

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
           *this,Boxed_Value *param)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  array<chaiscript::Boxed_Value,_1UL> params;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  undefined1 auStack_108 [16];
  undefined1 local_f8 [32];
  pthread_rwlock_t local_d8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_68;
  undefined8 uStack_60;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  *local_58;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_30 [2];
  
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)auStack_108,
             in_RDX);
  p_Var1 = param[1].m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88 = &local_98;
    local_98 = 0;
    uStack_90 = 0;
    local_d8._48_8_ = 0;
    uStack_a0 = 0;
    local_d8._32_8_ = 0;
    local_d8.__data.__pad2 = 0;
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_d8.__align = 0;
    local_d8._8_8_ = (Conversion_Saves *)0x0;
    local_58 = &local_68;
    local_78 = 0;
    uStack_70 = 0;
    local_68.m_key = (void *)0x0;
    uStack_60 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_80 = local_88;
    local_50 = local_58;
    local_f8._8_8_ =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*(local_30);
    local_f8._0_8_ = &local_d8;
    local_f8._24_8_ = local_f8;
    local_f8._16_8_ = auStack_108;
    Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::call
              ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                *)this,(Function_Params *)param,(Type_Conversions_State *)(local_f8 + 0x10));
    Type_Conversions::~Type_Conversions((Type_Conversions *)&local_d8.__data);
  }
  else {
    local_d8._8_8_ =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                   ((Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> *)
                    &p_Var1[10]._M_use_count);
    local_f8._8_8_ = local_f8;
    local_f8._0_8_ = (pthread_rwlock_t *)auStack_108;
    local_d8.__align = (long)p_Var1;
    Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::call
              ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                *)this,(Function_Params *)param,(Type_Conversions_State *)local_f8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_108 + 8));
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }